

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_UnknownFields_Test::TestBody
          (Proto3ArenaTest_UnknownFields_Test *this)

{
  bool bVar1;
  TestAllTypes *this_00;
  Reflection *pRVar2;
  char *pcVar3;
  UnknownFieldSet *this_01;
  char *in_R9;
  string local_4c0;
  AssertHelper local_4a0;
  Message local_498;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_470;
  Message local_468;
  size_t local_460;
  size_t local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar;
  UnknownFieldSet *unknown_fields;
  string_view local_418;
  TestAllTypes *local_408;
  TestAllTypes *arena_message;
  Arena arena;
  undefined1 local_348 [8];
  TestAllTypes original;
  Proto3ArenaTest_UnknownFields_Test *this_local;
  
  original.field_0._800_8_ = this;
  proto3_arena_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_348);
  SetAllFields((TestAllTypes *)local_348);
  Arena::Arena((Arena *)&arena_message);
  this_00 = Arena::Create<proto3_arena_unittest::TestAllTypes>((Arena *)&arena_message);
  local_408 = this_00;
  protobuf::MessageLite::SerializeAsString_abi_cxx11_
            ((string *)&unknown_fields,(MessageLite *)local_348);
  local_418 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&unknown_fields);
  protobuf::MessageLite::ParseFromString((MessageLite *)this_00,local_418);
  std::__cxx11::string::~string((string *)&unknown_fields);
  ExpectAllFieldsSet(local_408);
  pRVar2 = proto3_arena_unittest::TestAllTypes::GetReflection();
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Reflection::MutableUnknownFields(pRVar2,&local_408->super_Message);
  UnknownFieldSet::AddVarint
            ((UnknownFieldSet *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,1,2);
  local_458 = proto3_arena_unittest::TestAllTypes::ByteSizeLong((TestAllTypes *)local_348);
  local_460 = proto3_arena_unittest::TestAllTypes::ByteSizeLong(local_408);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_450,"original.ByteSizeLong()","arena_message->ByteSizeLong()",
             &local_458,&local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    testing::Message::~Message(&local_468);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pRVar2 = proto3_arena_unittest::TestAllTypes::GetReflection();
    this_01 = Reflection::GetUnknownFields(pRVar2,&local_408->super_Message);
    bVar1 = UnknownFieldSet::empty(this_01);
    local_489 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_488,&local_489,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
    if (!bVar1) {
      testing::Message::Message(&local_498);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4c0,(internal *)local_488,
                 (AssertionResult *)
                 "arena_message->GetReflection()->GetUnknownFields(*arena_message).empty()","true",
                 "false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_unittest.cc"
                 ,0x81,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      testing::Message::~Message(&local_498);
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  Arena::~Arena((Arena *)&arena_message);
  proto3_arena_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_348);
  return;
}

Assistant:

TEST(Proto3ArenaTest, UnknownFields) {
  TestAllTypes original;
  SetAllFields(&original);

  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->ParseFromString(original.SerializeAsString());
  ExpectAllFieldsSet(*arena_message);

  // In proto3 we can still get a pointer to the UnknownFieldSet through
  // reflection API.
  UnknownFieldSet* unknown_fields =
      arena_message->GetReflection()->MutableUnknownFields(arena_message);
  // We can modify this UnknownFieldSet.
  unknown_fields->AddVarint(1, 2);
  // And the unknown fields should be changed.
  ASSERT_NE(original.ByteSizeLong(), arena_message->ByteSizeLong());
  ASSERT_FALSE(
      arena_message->GetReflection()->GetUnknownFields(*arena_message).empty());
}